

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  
  uVar7 = insn & 0x1f;
  uVar5 = insn >> 10 & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  puVar6 = GPR32DecoderTable;
  DVar2 = MCDisassembler_Fail;
  uVar3 = uVar7;
  if ((int)uVar1 < 0x739) {
    switch(uVar1) {
    case 0x3a5:
    case 0x3a6:
    case 0x3a7:
    case 0x3ab:
    case 0x3ac:
    case 0x3ad:
      break;
    case 0x3a8:
    case 0x3ae:
switchD_001ef047_caseD_3a8:
      puVar6 = GPR64DecoderTable;
      break;
    case 0x3a9:
      goto switchD_001ef047_caseD_3a9;
    case 0x3aa:
switchD_001ef047_caseD_3aa:
      puVar6 = GPR64DecoderTable;
      goto LAB_001ef106;
    default:
      switch(uVar1) {
      case 0x429:
        goto switchD_001ef047_caseD_3a9;
      case 0x42a:
        goto switchD_001ef047_caseD_3aa;
      case 0x42b:
      case 0x42c:
      case 0x42d:
        break;
      case 0x42e:
        goto switchD_001ef047_caseD_3a8;
      default:
        goto switchD_001ef08f_default;
      }
    }
  }
  else {
    uVar4 = insn >> 0x10 & 0x1f;
    switch(uVar1) {
    case 0x739:
    case 0x73a:
    case 0x73b:
      goto switchD_001ef047_caseD_3a5;
    case 0x73c:
      goto switchD_001ef047_caseD_3a8;
    case 0x73d:
switchD_001ef06d_caseD_73d:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      break;
    case 0x73e:
switchD_001ef06d_caseD_73e:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_001ef047_caseD_3aa;
    case 0x73f:
    case 0x740:
    case 0x741:
switchD_001ef06d_caseD_73f:
      puVar6 = GPR32DecoderTable;
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_001ef047_caseD_3a5;
    case 0x742:
switchD_001ef06d_caseD_742:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_001ef047_caseD_3a8;
    default:
      switch(uVar1) {
      case 0x791:
        goto switchD_001ef06d_caseD_73d;
      case 0x792:
        goto switchD_001ef06d_caseD_73e;
      case 0x793:
      case 0x794:
      case 0x795:
        goto switchD_001ef06d_caseD_73f;
      case 0x796:
        goto switchD_001ef06d_caseD_742;
      default:
        goto switchD_001ef08f_default;
      }
    }
switchD_001ef047_caseD_3a9:
    puVar6 = GPR32DecoderTable;
LAB_001ef106:
    MCOperand_CreateReg0(Inst,puVar6[uVar7]);
    uVar3 = uVar5;
  }
switchD_001ef047_caseD_3a5:
  uVar4 = insn >> 5 & 0x1f;
  MCOperand_CreateReg0(Inst,puVar6[uVar3]);
  uVar3 = 4;
  if (uVar4 != 0x1f) {
    uVar3 = GPR64DecoderTable[uVar4];
  }
  MCOperand_CreateReg0(Inst,uVar3);
  if (((1 < uVar1 - 0x429) && (1 < uVar1 - 0x3a9)) ||
     (DVar2 = MCDisassembler_SoftFail, uVar7 != uVar5)) {
    DVar2 = MCDisassembler_Success;
  }
switchD_001ef08f_default:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	unsigned Rs = fieldFromInstruction(insn, 16, 5);
	unsigned Opcode = MCInst_getOpcode(Inst);

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_STLXRW:
		case AArch64_STLXRB:
		case AArch64_STLXRH:
		case AArch64_STXRW:
		case AArch64_STXRB:
		case AArch64_STXRH:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARW:
		case AArch64_LDARB:
		case AArch64_LDARH:
		case AArch64_LDAXRW:
		case AArch64_LDAXRB:
		case AArch64_LDAXRH:
		case AArch64_LDXRW:
		case AArch64_LDXRB:
		case AArch64_LDXRH:
		case AArch64_STLRW:
		case AArch64_STLRB:
		case AArch64_STLRH:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXRX:
		case AArch64_STXRX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARX:
		case AArch64_LDAXRX:
		case AArch64_LDXRX:
		case AArch64_STLRX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXPW:
		case AArch64_STXPW:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPW:
		case AArch64_LDXPW:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_STLXPX:
		case AArch64_STXPX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPX:
		case AArch64_LDXPX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);

	// You shouldn't load to the same register twice in an instruction...
	if ((Opcode == AArch64_LDAXPW || Opcode == AArch64_LDXPW ||
				Opcode == AArch64_LDAXPX || Opcode == AArch64_LDXPX) &&
			Rt == Rt2)
		return SoftFail;

	return Success;
}